

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

result __thiscall
fmt::v7::detail::fixed_handler::on_start
          (fixed_handler *this,uint64_t divisor,uint64_t remainder,uint64_t error,int *exp)

{
  int iVar1;
  bool bVar2;
  result rVar3;
  char cVar4;
  int iVar5;
  int iVar6;
  
  if (this->fixed != true) {
    return more;
  }
  iVar5 = this->exp10 + *exp;
  iVar1 = this->precision;
  iVar6 = iVar5 + this->precision;
  this->precision = iVar6;
  if (iVar6 != 0 && SCARRY4(iVar5,iVar1) == iVar6 < 0) {
    return more;
  }
  if (iVar6 < 0) {
    return done;
  }
  if (divisor <= remainder) {
    assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/include/fmt/format-inl.h"
                ,0x5cb,"");
  }
  if (divisor <= error) {
    assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/include/fmt/format-inl.h"
                ,0x5cc,"");
  }
  if (divisor - error <= error) {
    assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/include/fmt/format-inl.h"
                ,0x5cd,"");
  }
  if ((divisor - remainder < remainder) || (divisor + remainder * -2 < error * 2)) {
    if ((remainder < error) || (remainder - error < divisor - (remainder - error))) {
      cVar4 = '0';
      bVar2 = true;
      goto LAB_003a5444;
    }
    cVar4 = '1';
  }
  else {
    cVar4 = '0';
  }
  bVar2 = false;
LAB_003a5444:
  rVar3 = error;
  if (!bVar2) {
    iVar1 = this->size;
    this->size = iVar1 + 1;
    this->buf[iVar1] = cVar4;
    rVar3 = done;
  }
  return rVar3;
}

Assistant:

digits::result on_start(uint64_t divisor, uint64_t remainder, uint64_t error,
                          int& exp) {
    // Non-fixed formats require at least one digit and no precision adjustment.
    if (!fixed) return digits::more;
    // Adjust fixed precision by exponent because it is relative to decimal
    // point.
    precision += exp + exp10;
    // Check if precision is satisfied just by leading zeros, e.g.
    // format("{:.2f}", 0.001) gives "0.00" without generating any digits.
    if (precision > 0) return digits::more;
    if (precision < 0) return digits::done;
    auto dir = get_round_direction(divisor, remainder, error);
    if (dir == round_direction::unknown) return digits::error;
    buf[size++] = dir == round_direction::up ? '1' : '0';
    return digits::done;
  }